

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

AActor * P_SpawnMissileXYZ(DVector3 *pos,AActor *source,AActor *dest,PClassActor *type,
                          bool checkspawn,AActor *owner)

{
  char *pcVar1;
  double dVar2;
  double __x;
  double dVar3;
  BYTE BVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  AActor *missile;
  undefined4 extraout_var;
  double dVar9;
  DVector3 velocity;
  DVector3 local_48;
  
  if (source != (AActor *)0x0) {
    if (dest == (AActor *)0x0) {
      pcVar1 = FName::NameData.NameArray
               [(type->super_PClass).super_PStruct.super_PNamedType.TypeName.Index].Text;
      if ((source->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar6 = (**(source->super_DThinker).super_DObject._vptr_DObject)(source);
        (source->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar6);
      }
      Printf("P_SpawnMissilyXYZ: Tried to shoot %s from %s with no dest\n",pcVar1,
             FName::NameData.NameArray
             [(((source->super_DThinker).super_DObject.Class)->super_PStruct).super_PNamedType.
              TypeName.Index].Text);
      return (AActor *)0x0;
    }
    dVar9 = pos->Z;
    if (((dVar9 != -2147483648.0) || (NAN(dVar9))) && ((dVar9 != 2147483647.0 || (NAN(dVar9))))) {
      pos->Z = dVar9 - source->Floorclip;
    }
    missile = AActor::StaticSpawn(type,pos,ALLOW_REPLACE,false);
    P_PlaySpawnSound(missile,source);
    if (owner == (AActor *)0x0) {
      owner = source;
    }
    (missile->target).field_0.p = owner;
    dVar9 = missile->Speed;
    AActor::Vec3To(&local_48,source,dest);
    if (((missile->flags3).Value & 3) == 0) {
      dVar2 = (source->__Pos).Z;
      if (dest->Height <= pos->Z - dVar2) {
        local_48.Z = dVar2 + (dest->Height - pos->Z) + local_48.Z;
      }
    }
    else {
      local_48.Z = 0.0;
    }
    dVar2 = c_sqrt(local_48.Z * local_48.Z + local_48.Y * local_48.Y + local_48.X * local_48.X);
    dVar9 = dVar9 / dVar2;
    (missile->Vel).Z = dVar9 * local_48.Z;
    (missile->Vel).Y = local_48.Y * dVar9;
    (missile->Vel).X = local_48.X * dVar9;
    if ((((dest->flags).Value & 0x40000) != 0) && (((source->flags6).Value & 0x1000000) == 0)) {
      uVar7 = FRandom::GenRand32(&pr_spawnmissile);
      uVar8 = FRandom::GenRand32(&pr_spawnmissile);
      __x = FFastTrig::cos(&fasttrig,
                           (double)(int)((uVar7 & 0xff) - (uVar8 & 0xff)) * 0.087890625 *
                           11930464.711111112 + 6755399441055744.0);
      dVar3 = FFastTrig::sin(&fasttrig,__x);
      dVar9 = (missile->Vel).X;
      dVar2 = (missile->Vel).Y;
      (missile->Vel).X = __x * dVar9 - dVar3 * dVar2;
      (missile->Vel).Y = __x * dVar2 + dVar3 * dVar9;
    }
    dVar9 = c_atan2((missile->Vel).Y,(missile->Vel).X);
    (missile->Angles).Yaw.Degrees = dVar9 * 57.29577951308232;
    if (((missile->flags4).Value & 0x40000) != 0) {
      if (owner->player == (player_t *)0x0) {
        BVar4 = '\0';
      }
      else {
        BVar4 = (char)((int)owner->player - 0xa39290U >> 5) * '=' + '\x01';
      }
      missile->FriendPlayer = BVar4;
    }
    if (!checkspawn) {
      return missile;
    }
    bVar5 = P_CheckMissileSpawn(missile,source->radius);
    if (bVar5) {
      return missile;
    }
  }
  return (AActor *)0x0;
}

Assistant:

AActor *P_SpawnMissileXYZ (DVector3 pos, AActor *source, AActor *dest, PClassActor *type, bool checkspawn, AActor *owner)
{
	if (source == NULL)
	{
		return NULL;
	}

	if (dest == NULL)
	{
		Printf ("P_SpawnMissilyXYZ: Tried to shoot %s from %s with no dest\n",
			type->TypeName.GetChars(), source->GetClass()->TypeName.GetChars());
		return NULL;
	}

	if (pos.Z != ONFLOORZ && pos.Z != ONCEILINGZ)
	{
		pos.Z -= source->Floorclip;
	}

	AActor *th = Spawn (type, pos, ALLOW_REPLACE);
	
	P_PlaySpawnSound(th, source);

	// record missile's originator
	if (owner == NULL) owner = source;
	th->target = owner;

	double speed = th->Speed;

	// [RH]
	// Hexen calculates the missile velocity based on the source's location.
	// Would it be more useful to base it on the actual position of the
	// missile?
	// Answer: No, because this way, you can set up sets of parallel missiles.

	DVector3 velocity = source->Vec3To(dest);
	// Floor and ceiling huggers should never have a vertical component to their velocity
	if (th->flags3 & (MF3_FLOORHUGGER|MF3_CEILINGHUGGER))
	{
		velocity.Z = 0;
	}
	// [RH] Adjust the trajectory if the missile will go over the target's head.
	else if (pos.Z - source->Z() >= dest->Height)
	{
		velocity.Z += (dest->Height - pos.Z + source->Z());
	}
	th->Vel = velocity.Resized(speed);

	// invisible target: rotate velocity vector in 2D
	// [RC] Now monsters can aim at invisible player as if they were fully visible.
	if (dest->flags & MF_SHADOW && !(source->flags6 & MF6_SEEINVISIBLE))
	{
		DAngle an = pr_spawnmissile.Random2() * (22.5 / 256);
		double c = an.Cos();
		double s = an.Sin();
		
		double newx = th->Vel.X * c - th->Vel.Y * s;
		double newy = th->Vel.X * s + th->Vel.Y * c;

		th->Vel.X = newx;
		th->Vel.Y = newy;
	}

	th->AngleFromVel();

	if (th->flags4 & MF4_SPECTRAL)
	{
		th->SetFriendPlayer(owner->player);
	}

	return (!checkspawn || P_CheckMissileSpawn (th, source->radius)) ? th : NULL;
}